

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

void __thiscall
cmMakefile::AddSourceGroup
          (cmMakefile *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *name,char *regex)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pbVar2;
  bool bVar3;
  cmMakefile *this_00;
  uint uVar4;
  cmSourceGroup *this_01;
  string *psVar5;
  long lVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  currentName;
  char *local_348;
  cmMakefile *local_340;
  string local_338;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_318;
  ulong local_2f8;
  cmSourceGroup local_2f0;
  
  local_318.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_318.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_318.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar7 = (int)((ulong)((long)(name->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(name->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start) >> 5) - 1;
  local_348 = regex;
  if (-1 < (int)uVar7) {
    local_2f8 = (ulong)uVar7;
    lVar6 = local_2f8 * 0x20 + 0x20;
    iVar8 = 0;
    lVar9 = local_2f8 + 1;
    local_340 = this;
    do {
      pbVar2 = (name->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_assign_aux<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_318,
                 pbVar2,(long)&(pbVar2->_M_dataplus)._M_p + lVar6);
      this_01 = GetSourceGroup(local_340,&local_318);
      this_00 = local_340;
      if (this_01 != (cmSourceGroup *)0x0) {
        if (iVar8 == 0) {
          if (local_348 != (char *)0x0) {
            cmSourceGroup::SetGroupRegex(this_01,local_348);
          }
          goto LAB_001ed2a4;
        }
        if (lVar9 != 0) {
          uVar4 = (int)local_2f8 - iVar8;
          goto LAB_001ed1dd;
        }
        break;
      }
      iVar8 = iVar8 + 1;
      lVar6 = lVar6 + -0x20;
      lVar10 = lVar9 + -1;
      bVar3 = 0 < lVar9;
      lVar9 = lVar10;
    } while (lVar10 != 0 && bVar3);
    std::vector<cmSourceGroup,std::allocator<cmSourceGroup>>::
    emplace_back<std::__cxx11::string_const&,char_const*&>
              ((vector<cmSourceGroup,std::allocator<cmSourceGroup>> *)&local_340->SourceGroups,
               (name->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start,&local_348);
    this_01 = GetSourceGroup(this_00,&local_318);
    if (this_01 == (cmSourceGroup *)0x0) {
      paVar1 = &local_2f0.Name.field_2;
      local_2f0.Name._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2f0,"Could not create source group ","");
      cmSystemTools::Error(&local_2f0.Name);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f0.Name._M_dataplus._M_p != paVar1) {
        operator_delete(local_2f0.Name._M_dataplus._M_p,
                        local_2f0.Name.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      uVar4 = 0;
LAB_001ed1dd:
      if ((int)uVar7 < (int)uVar4) {
        uVar7 = uVar4;
      }
      lVar6 = ~(ulong)uVar7 + (long)(int)uVar4;
      lVar9 = (long)(int)uVar4 * 0x20;
      while( true ) {
        lVar6 = lVar6 + 1;
        if (lVar6 == 0) break;
        pbVar2 = (name->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
        lVar10 = *(long *)((long)&pbVar2[1]._M_dataplus._M_p + lVar9);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_338,lVar10,
                   *(long *)((long)&pbVar2[1]._M_string_length + lVar9) + lVar10);
        psVar5 = cmSourceGroup::GetFullName_abi_cxx11_(this_01);
        cmSourceGroup::cmSourceGroup(&local_2f0,&local_338,(char *)0x0,(psVar5->_M_dataplus)._M_p);
        cmSourceGroup::AddChild(this_01,&local_2f0);
        cmSourceGroup::~cmSourceGroup(&local_2f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_338._M_dataplus._M_p != &local_338.field_2) {
          operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
        }
        this_01 = cmSourceGroup::LookupChild
                            (this_01,(string *)
                                     ((long)&(name->
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             )._M_impl.super__Vector_impl_data._M_start[1].
                                             _M_dataplus._M_p + lVar9));
        lVar9 = lVar9 + 0x20;
      }
      cmSourceGroup::SetGroupRegex(this_01,local_348);
    }
  }
LAB_001ed2a4:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_318);
  return;
}

Assistant:

void cmMakefile::AddSourceGroup(const std::vector<std::string>& name,
                                const char* regex)
{
  cmSourceGroup* sg = nullptr;
  std::vector<std::string> currentName;
  int i = 0;
  const int lastElement = static_cast<int>(name.size() - 1);
  for (i = lastElement; i >= 0; --i) {
    currentName.assign(name.begin(), name.begin() + i + 1);
    sg = this->GetSourceGroup(currentName);
    if (sg != nullptr) {
      break;
    }
  }

  // i now contains the index of the last found component
  if (i == lastElement) {
    // group already exists, replace its regular expression
    if (regex && sg) {
      // We only want to set the regular expression.  If there are already
      // source files in the group, we don't want to remove them.
      sg->SetGroupRegex(regex);
    }
    return;
  }
  if (i == -1) {
    // group does not exist nor belong to any existing group
    // add its first component
    this->SourceGroups.emplace_back(name[0], regex);
    sg = this->GetSourceGroup(currentName);
    i = 0; // last component found
  }
  if (!sg) {
    cmSystemTools::Error("Could not create source group ");
    return;
  }
  // build the whole source group path
  for (++i; i <= lastElement; ++i) {
    sg->AddChild(cmSourceGroup(name[i], nullptr, sg->GetFullName().c_str()));
    sg = sg->LookupChild(name[i]);
  }

  sg->SetGroupRegex(regex);
}